

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code.hpp
# Opt level: O0

int __thiscall
system_error2::status_code<system_error2::detail::erased<long,_true>_>::clone
          (status_code<system_error2::detail::erased<long,_true>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  status_code_domain *psVar1;
  byte bVar2;
  undefined1 local_40 [31];
  undefined1 local_21;
  status_code<system_error2::detail::erased<long,_true>_> *local_20;
  status_code<system_error2::detail::erased<long,_true>_> *this_local;
  status_code<system_error2::detail::erased<long,_true>_> x;
  
  local_20 = this;
  if ((this->
      super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
      ).super_status_code_storage<system_error2::detail::erased<long,_true>_>.
      super_status_code<void>._domain == (status_code_domain *)0x0) {
    memset(&this_local,0,0x10);
    status_code((status_code<system_error2::detail::erased<long,_true>_> *)&this_local);
  }
  else {
    local_21 = 0;
    status_code((status_code<system_error2::detail::erased<long,_true>_> *)&this_local);
    psVar1 = (this->
             super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
             ).super_status_code_storage<system_error2::detail::erased<long,_true>_>.
             super_status_code<void>._domain;
    (**(code **)(*(long *)psVar1 + 8))(local_40);
    bVar2 = (**(code **)(*(long *)psVar1 + 0x38))
                      (psVar1,(status_code<system_error2::detail::erased<long,_true>_> *)&this_local
                       ,this);
    if ((bVar2 & 1) == 0) {
      abort();
    }
  }
  return (int)this_local;
}

Assistant:

SYSTEM_ERROR2_CONSTEXPR20 status_code clone() const
  {
    if(nullptr == this->_domain)
    {
      return {};
    }
    status_code x;
    if(!this->_domain->_do_erased_copy(x, *this, this->_domain->payload_info()))
    {
      abort();  // should not be possible
    }
    return x;
  }